

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O1

void __thiscall
CRPCCommand::CRPCCommand
          (CRPCCommand *this,string category,string name,Actor actor,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          args,intptr_t unique_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_R8;
  intptr_t in_R9;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &(this->category).field_2;
  (this->category)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(unique_id + 0x10);
  if (*(size_type **)unique_id == psVar2) {
    uVar7 = *(undefined8 *)(unique_id + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->category).field_2 + 8) = uVar7;
  }
  else {
    (this->category)._M_dataplus._M_p = (pointer)*(size_type **)unique_id;
    (this->category).field_2._M_allocated_capacity = *psVar2;
  }
  (this->category)._M_string_length = *(size_type *)(unique_id + 8);
  *(size_type **)unique_id = psVar2;
  *(undefined8 *)(unique_id + 8) = 0;
  *(undefined1 *)(unique_id + 0x10) = 0;
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(in_RDX + 2);
  if ((size_type *)*in_RDX == psVar2) {
    lVar8 = in_RDX[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(long *)((long)&(this->name).field_2 + 8) = lVar8;
  }
  else {
    (this->name)._M_dataplus._M_p = (pointer)*in_RDX;
    (this->name).field_2._M_allocated_capacity = *psVar2;
  }
  (this->name)._M_string_length = in_RDX[1];
  *in_RDX = (long)psVar2;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  (this->actor).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->actor).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->actor).super__Function_base._M_functor + 8) = 0;
  (this->actor)._M_invoker = (_Invoker_type)in_RCX[3];
  if (in_RCX[2] != 0) {
    uVar7 = in_RCX[1];
    *(undefined8 *)&(this->actor).super__Function_base._M_functor = *in_RCX;
    *(undefined8 *)((long)&(this->actor).super__Function_base._M_functor + 8) = uVar7;
    (this->actor).super__Function_base._M_manager = (_Manager_type)in_RCX[2];
    in_RCX[2] = 0;
    in_RCX[3] = 0;
  }
  uVar4 = *(undefined4 *)((long)in_R8 + 4);
  uVar5 = *(undefined4 *)(in_R8 + 1);
  uVar6 = *(undefined4 *)((long)in_R8 + 0xc);
  *(undefined4 *)
   &(this->argNames).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)in_R8;
  *(undefined4 *)
   ((long)&(this->argNames).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = uVar4;
  *(undefined4 *)
   &(this->argNames).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = uVar5;
  *(undefined4 *)
   ((long)&(this->argNames).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar6;
  (this->argNames).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_R8[2];
  *in_R8 = 0;
  in_R8[1] = 0;
  in_R8[2] = 0;
  this->unique_id = in_R9;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCCommand(std::string category, std::string name, Actor actor, std::vector<std::pair<std::string, bool>> args, intptr_t unique_id)
        : category(std::move(category)), name(std::move(name)), actor(std::move(actor)), argNames(std::move(args)),
          unique_id(unique_id)
    {
    }